

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O1

void __thiscall Matrix::Matrix(Matrix *this,int r,int c)

{
  allocator_type local_3e;
  allocator_type local_3d;
  value_type_conflict1 local_3c;
  vector<float,_std::allocator<float>_> local_38;
  
  local_3c = 0.0;
  std::vector<float,_std::allocator<float>_>::vector(&local_38,(long)c,&local_3c,&local_3d);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(&this->m,(long)r,&local_38,&local_3e);
  if (local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  this->rows = r;
  this->cols = c;
  return;
}

Assistant:

Matrix::Matrix(int r, int c) : m(std::vector<std::vector<float> >(r, std::vector<float>(c, 0.f))), rows(r), cols(c) {}